

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_CCtx * ZSTDMT_createCCtx_advanced(uint nbWorkers,ZSTD_customMem cMem)

{
  ZSTDMT_CCtx *pZVar1;
  uint nbWorkers_local;
  
  pZVar1 = ZSTDMT_createCCtx_advanced_internal(nbWorkers,cMem);
  return pZVar1;
}

Assistant:

ZSTDMT_CCtx* ZSTDMT_createCCtx_advanced(unsigned nbWorkers, ZSTD_customMem cMem)
{
#ifdef ZSTD_MULTITHREAD
    return ZSTDMT_createCCtx_advanced_internal(nbWorkers, cMem);
#else
    (void)nbWorkers;
    (void)cMem;
    return NULL;
#endif
}